

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialQueue.cpp
# Opt level: O0

void __thiscall llbuild::basic::SerialQueue::sync(SerialQueue *this)

{
  SerialQueueImpl *this_00;
  function<void_()> *in_RSI;
  function<void_()> local_38;
  function<void_()> *fn_local;
  SerialQueue *this_local;
  
  this_00 = (SerialQueueImpl *)this->impl;
  fn_local = (function<void_()> *)this;
  std::function<void_()>::function(&local_38,in_RSI);
  anon_unknown.dwarf_3da423::SerialQueueImpl::sync(this_00);
  std::function<void_()>::~function(&local_38);
  return;
}

Assistant:

void SerialQueue::sync(std::function<void(void)> fn) {
  static_cast<SerialQueueImpl*>(impl)->sync(fn);
}